

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O1

int language::formatSpecialCharacter(QTextStream *str,ushort value)

{
  int iVar1;
  int iVar2;
  undefined6 in_register_00000032;
  char *pcVar3;
  
  iVar2 = (int)CONCAT62(in_register_00000032,value);
  if (iVar2 == 10) {
    iVar1 = 5;
    pcVar3 = "\\n\"\n\"";
  }
  else {
    iVar1 = 2;
    if (iVar2 == 0x5c) {
      pcVar3 = "\\\\";
    }
    else {
      if (iVar2 != 0x22) {
        return 0;
      }
      pcVar3 = "\\\"";
    }
  }
  QTextStream::operator<<(str,pcVar3);
  return iVar1;
}

Assistant:

static int formatSpecialCharacter(QTextStream &str, ushort value)
{
    int length = 0;
    switch (value) {
    case '\\':
        str << "\\\\";
        length += 2;
        break;
    case '\"':
        str << "\\\"";
        length += 2;
        break;
    case '\n':
        str << "\\n\"\n\"";
        length += 5;
        break;
    default:
        break;
    }
    return length;
}